

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode cr_lc_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                   _Bool *peos)

{
  void *pvVar1;
  Curl_creader *pCVar2;
  curl_trc_feat *pcVar3;
  _Bool _Var4;
  byte bVar5;
  CURLcode CVar6;
  void *pvVar7;
  bufq *q;
  byte bVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  _Bool eos;
  size_t nread;
  size_t n;
  _Bool local_5a;
  byte local_59;
  bufq *local_58;
  Curl_easy *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  pvVar1 = reader->ctx;
  if ((*(byte *)((long)pvVar1 + 0x60) & 2) != 0) {
LAB_00154714:
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  local_58 = (bufq *)((long)pvVar1 + 0x20);
  local_50 = data;
  local_40 = blen;
  _Var4 = Curl_bufq_is_empty(local_58);
  if (_Var4) {
    if ((*(byte *)((long)pvVar1 + 0x60) & 1) != 0) {
      *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
      goto LAB_00154714;
    }
    pCVar2 = reader->next;
    local_48 = 0;
    local_5a = false;
    if (pCVar2 == (Curl_creader *)0x0) {
      CVar6 = CURLE_READ_ERROR;
    }
    else {
      CVar6 = (*pCVar2->crt->do_read)(local_50,pCVar2,buf,local_40,&local_48,&local_5a);
    }
    sVar10 = local_48;
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    bVar8 = *(byte *)((long)pvVar1 + 0x60) & 0xfe | local_5a;
    *(byte *)((long)pvVar1 + 0x60) = bVar8;
    bVar5 = local_5a;
    if (local_48 != 0) {
      local_59 = local_5a;
      pvVar7 = memchr(buf,10,local_48);
      bVar5 = local_59;
      if (pvVar7 != (void *)0x0) {
        if (local_48 == 0) {
          uVar9 = 0;
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          uVar9 = 0;
          q = local_58;
          do {
            if ((buf[uVar9] == '\n') && ((*(byte *)((long)pvVar1 + 0x60) & 4) == 0)) {
              CVar6 = Curl_bufq_cwrite(q,buf + uVar11,uVar9 - uVar11,&local_38);
              if (CVar6 == CURLE_OK) {
                CVar6 = Curl_bufq_cwrite(local_58,"\r\n",2,&local_38);
              }
              if (CVar6 != CURLE_OK) {
                return CVar6;
              }
              uVar11 = uVar9 + 1;
              q = local_58;
            }
            else {
              *(byte *)((long)pvVar1 + 0x60) =
                   *(byte *)((long)pvVar1 + 0x60) & 0xfb | (buf[uVar9] == '\r') << 2;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < local_48);
        }
        if ((uVar11 <= uVar9 && uVar9 - uVar11 != 0) &&
           (CVar6 = Curl_bufq_cwrite(local_58,buf + uVar11,uVar9 - uVar11,&local_38),
           CVar6 != CURLE_OK)) {
          return CVar6;
        }
        goto LAB_00154865;
      }
    }
    if (bVar5 != 0) {
      *(byte *)((long)pvVar1 + 0x60) = bVar8 | 2;
    }
    *pnread = sVar10;
    _Var4 = (_Bool)(*(byte *)((long)pvVar1 + 0x60) >> 1 & 1);
    sVar10 = local_40;
  }
  else {
LAB_00154865:
    sVar10 = local_40;
    *peos = false;
    CVar6 = Curl_bufq_cread(local_58,buf,local_40,pnread);
    uVar11 = (ulong)CVar6;
    if (((CVar6 != CURLE_OK) || (uVar11 = 0, (*(byte *)((long)pvVar1 + 0x60) & 1) == 0)) ||
       (_Var4 = Curl_bufq_is_empty(local_58), !_Var4)) goto LAB_001548b5;
    *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
    _Var4 = true;
  }
  *peos = _Var4;
  uVar11 = 0;
LAB_001548b5:
  if ((((local_50 != (Curl_easy *)0x0) && (((local_50->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar3 = (local_50->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
      ) && (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(local_50,"cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",sVar10,uVar11,*pnread,
                  (ulong)*peos);
  }
  return (CURLcode)uVar11;
}

Assistant:

static CURLcode cr_lc_read(struct Curl_easy *data,
                           struct Curl_creader *reader,
                           char *buf, size_t blen,
                           size_t *pnread, bool *peos)
{
  struct cr_lc_ctx *ctx = reader->ctx;
  CURLcode result;
  size_t nread, i, start, n;
  bool eos;

  if(ctx->eos) {
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }

  if(Curl_bufq_is_empty(&ctx->buf)) {
    if(ctx->read_eos) {
      ctx->eos = TRUE;
      *pnread = 0;
      *peos = TRUE;
      return CURLE_OK;
    }
    /* Still getting data form the next reader, ctx->buf is empty */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;
    ctx->read_eos = eos;

    if(!nread || !memchr(buf, '\n', nread)) {
      /* nothing to convert, return this right away */
      if(ctx->read_eos)
        ctx->eos = TRUE;
      *pnread = nread;
      *peos = ctx->eos;
      goto out;
    }

    /* at least one \n might need conversion to '\r\n', place into ctx->buf */
    for(i = start = 0; i < nread; ++i) {
      /* if this byte is not an LF character, or if the preceding character is
         a CR (meaning this already is a CRLF pair), go to next */
      if((buf[i] != '\n') || ctx->prev_cr) {
        ctx->prev_cr = (buf[i] == '\r');
        continue;
      }
      ctx->prev_cr = FALSE;
      /* on a soft limit bufq, we do not need to check length */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(!result)
        result = Curl_bufq_cwrite(&ctx->buf, STRCONST("\r\n"), &n);
      if(result)
        return result;
      start = i + 1;
    }

    if(start < i) { /* leftover */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(result)
        return result;
    }
  }

  DEBUGASSERT(!Curl_bufq_is_empty(&ctx->buf));
  *peos = FALSE;
  result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
    *peos = TRUE;
  }

out:
  CURL_TRC_READ(data, "cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *pnread, *peos);
  return result;
}